

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall
QColumnViewDelegate::paint
          (QColumnViewDelegate *this,QPainter *painter,QStyleOptionViewItem *option,
          QModelIndex *index)

{
  LayoutDirection LVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  ulong uVar4;
  QStyle *pQVar5;
  int iVar6;
  long in_FS_OFFSET;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  LVar1 = (option->super_QStyleOption).direction;
  iVar6 = (((option->super_QStyleOption).rect.y2.m_i - (option->super_QStyleOption).rect.y1.m_i) * 2
          + 2) / 3;
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108,option);
  if (LVar1 == RightToLeft) {
    local_108.super_QStyleOption.rect.x1.m_i = local_108.super_QStyleOption.rect.x1.m_i + iVar6;
  }
  else {
    local_108.super_QStyleOption.rect.x2.m_i = local_108.super_QStyleOption.rect.x2.m_i - iVar6;
  }
  pQVar2 = (index->m).ptr;
  uVar4 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,index);
  if ((uVar4 & 0x20) == 0) {
    local_108.showDecorationSelected = true;
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
  }
  QStyledItemDelegate::paint((QStyledItemDelegate *)this,painter,&local_108,index);
  if (LVar1 == RightToLeft) {
    local_108.super_QStyleOption.rect.x1.m_i = (option->super_QStyleOption).rect.x1.m_i;
    local_108.super_QStyleOption.rect.x2.m_i = iVar6 + local_108.super_QStyleOption.rect.x1.m_i + -1
    ;
  }
  else {
    local_108.super_QStyleOption.rect.x2.m_i = (option->super_QStyleOption).rect.x2.m_i;
    local_108.super_QStyleOption.rect.x1.m_i =
         (local_108.super_QStyleOption.rect.x2.m_i - iVar6) + 1;
  }
  local_108.super_QStyleOption.rect.y1.m_i = (option->super_QStyleOption).rect.y1.m_i;
  local_108.super_QStyleOption.rect.y2.m_i = (option->super_QStyleOption).rect.y2.m_i;
  pQVar2 = (index->m).ptr;
  cVar3 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,index);
  if (cVar3 != '\0') {
    if (local_108.widget == (QWidget *)0x0) {
      pQVar5 = QApplication::style();
    }
    else {
      pQVar5 = QWidget::style(local_108.widget);
    }
    (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,0x2a,&local_108,painter,local_108.widget);
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewDelegate::paint(QPainter *painter,
                          const QStyleOptionViewItem &option,
                          const QModelIndex &index) const
{
    bool reverse = (option.direction == Qt::RightToLeft);
    int width = ((option.rect.height() * 2) / 3);
    // Modify the options to give us room to add an arrow
    QStyleOptionViewItem opt = option;
    if (reverse)
        opt.rect.adjust(width,0,0,0);
    else
        opt.rect.adjust(0,0,-width,0);

    if (!(index.model()->flags(index) & Qt::ItemIsEnabled)) {
        opt.showDecorationSelected = true;
        opt.state |= QStyle::State_Selected;
    }

    QStyledItemDelegate::paint(painter, opt, index);

    if (reverse)
        opt.rect = QRect(option.rect.x(), option.rect.y(), width, option.rect.height());
    else
        opt.rect = QRect(option.rect.x() + option.rect.width() - width, option.rect.y(),
                         width, option.rect.height());

    // Draw >
    if (index.model()->hasChildren(index)) {
        const QWidget *view = opt.widget;
        QStyle *style = view ? view->style() : QApplication::style();
        style->drawPrimitive(QStyle::PE_IndicatorColumnViewArrow, &opt, painter, view);
    }
}